

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_rdpmc_x86_64(CPUX86State *env)

{
  uintptr_t unaff_retaddr;
  CPUX86State *env_local;
  
  if (((env->cr[4] & 0x100) != 0) && ((env->hflags & 3) != 0)) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  cpu_svm_check_intercept_param_x86_64(env,0x6f,0,unaff_retaddr);
  raise_exception_err_x86_64(env,6,0);
}

Assistant:

void helper_rdpmc(CPUX86State *env)
{
    if ((env->cr[4] & CR4_PCE_MASK) && ((env->hflags & HF_CPL_MASK) != 0)) {
        raise_exception_ra(env, EXCP0D_GPF, GETPC());
    }
    cpu_svm_check_intercept_param(env, SVM_EXIT_RDPMC, 0, GETPC());

    /* currently unimplemented */
    qemu_log_mask(LOG_UNIMP, "x86: unimplemented rdpmc\n");
    raise_exception_err(env, EXCP06_ILLOP, 0);
}